

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  basic_command_line_parser<char> *pbVar4;
  size_type sVar5;
  variable_value *pvVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  const_reference __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str_00;
  char **ppcVar7;
  char **ppcVar8;
  bool bVar9;
  string local_358;
  undefined1 local_331;
  int local_330;
  bool result;
  string local_328;
  undefined1 local_308 [8];
  string mode;
  string local_2e0;
  undefined1 local_2c0 [8];
  string filepath;
  key_type local_298;
  allocator<char> local_271;
  key_type local_270;
  basic_command_line_parser<char> local_250;
  basic_parsed_options<char> local_1d8;
  variables_map local_1b0 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1a0 [144];
  positional_options_description local_110 [8];
  positional_options_description p;
  undefined8 local_d8 [3];
  allocator<char> local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description desc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"Allowed options",&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"mode,m",(char *)ptVar2);
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"input-file",(char *)ptVar3);
  boost::program_options::positional_options_description::positional_options_description(local_110);
  boost::program_options::positional_options_description::add((char *)local_110,0x121078);
  boost::program_options::variables_map::variables_map(local_1b0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_250,argc,argv);
  pbVar4 = boost::program_options::basic_command_line_parser<char>::options(&local_250,local_98);
  pbVar4 = boost::program_options::basic_command_line_parser<char>::positional(pbVar4,local_110);
  boost::program_options::basic_command_line_parser<char>::run(&local_1d8,pbVar4);
  boost::program_options::store((basic_parsed_options *)&local_1d8,local_1b0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1d8);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_250);
  boost::program_options::notify(local_1b0);
  std::allocator<char>::allocator();
  filepath.field_2._M_local_buf[0xe] = '\0';
  filepath.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"input-file",&local_271);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1a0,&local_270);
  bVar9 = false;
  if (sVar5 != 0) {
    std::allocator<char>::allocator();
    filepath.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"mode",(allocator<char> *)(filepath.field_2._M_local_buf + 0xf))
    ;
    filepath.field_2._M_local_buf[0xd] = '\x01';
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_1a0,&local_298);
    bVar9 = sVar5 != 0;
  }
  if ((filepath.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_298);
  }
  if ((filepath.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(filepath.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  if (bVar9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"input-file",
               (allocator<char> *)(mode.field_2._M_local_buf + 0xf));
    pvVar6 = boost::program_options::variables_map::operator[](local_1b0,&local_2e0);
    this = boost::program_options::variable_value::
           as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pvVar6);
    __str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front(this);
    std::__cxx11::string::string((string *)local_2c0,__str);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"mode",(allocator<char> *)&result);
    pvVar6 = boost::program_options::variables_map::operator[](local_1b0,&local_328);
    __str_00 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar6);
    std::__cxx11::string::string((string *)local_308,__str_00);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&result);
    ppcVar7 = std::begin<char_const*,5ul>((char *(*) [5])tester::test_mode);
    ppcVar8 = std::end<char_const*,5ul>((char *(*) [5])tester::test_mode);
    ppcVar7 = std::find<char_const**,std::__cxx11::string>
                        (ppcVar7,ppcVar8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_308);
    ppcVar8 = std::end<char_const*,5ul>((char *(*) [5])tester::test_mode);
    if (ppcVar7 == ppcVar8) {
      argv_local._4_4_ = 1;
      local_330 = 1;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
      bVar9 = lexer_tester::test_file(&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      local_331 = bVar9;
      if (bVar9) {
        print<char[5]>((char (*) [5])"PASS");
        local_330 = 0;
      }
      else {
        print<char[5]>((char (*) [5])"FAIL");
        argv_local._4_4_ = 1;
        local_330 = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_308);
    std::__cxx11::string::~string((string *)local_2c0);
    if (local_330 != 0) goto LAB_00108fc1;
  }
  else {
    print<char[36]>((char (*) [36])"USAGE: ./tester <flags> <test file>");
    print<char[7]>((char (*) [7])"FLAGS:");
    print<char[33]>((char (*) [33])"\t-help/-h : display this message");
    print<char[55]>((char (*) [55])"\t-mode/-m : [lexer/parser/semantics/codegen/optimizer]");
  }
  argv_local._4_4_ = 0;
  local_330 = 1;
LAB_00108fc1:
  boost::program_options::variables_map::~variables_map(local_1b0);
  boost::program_options::positional_options_description::~positional_options_description(local_110)
  ;
  boost::program_options::options_description::~options_description(local_98);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {

    po::options_description desc("Allowed options");
    desc.add_options()
            ("help,h", "produce help message")
            ("mode,m", po::value<string>(), "mode")
            ("input-file", po::value< vector<string> >(), "input file")
            ;

    po::positional_options_description p;
    p.add("input-file", -1);

    po::variables_map vm;
    po::store(po::command_line_parser(argc, argv).
            options(desc).positional(p).run(), vm);
    po::notify(vm);

    if (vm.count("input-file") && vm.count("mode")) {
        string filepath = vm["input-file"].as< vector<string> >().front();
        string mode = vm["mode"].as<string>();

        if(!(exists_in_set(mode, test_mode))) {
            return 1;
        }

        // Handle file
        bool result = lexer_tester::test_file(filepath);

        if(result) {
            print("PASS");
        }
        else {
            print("FAIL");
            return 1;
        }
    }
    else {
        print("USAGE: ./tester <flags> <test file>");
        print("FLAGS:");
        print("\t-help/-h : display this message");
        print("\t-mode/-m : [lexer/parser/semantics/codegen/optimizer]");
    }

    return 0;

}